

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

void print_jit_status(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  lua_getfield(L,0xffffd8f0,"_LOADED");
  lua_getfield(L,0xffffffff,"jit");
  lua_remove(L,0xfffffffe);
  lua_getfield(L,0xffffffff,"status");
  lua_remove(L,0xfffffffe);
  iVar1 = lua_gettop(L);
  lua_call(L,0,0xffffffff);
  iVar2 = lua_toboolean(L,iVar1);
  pcVar3 = "JIT: ON";
  if (iVar2 == 0) {
    pcVar3 = "JIT: OFF";
  }
  fputs(pcVar3,_stdout);
  pcVar3 = (char *)lua_tolstring(L,iVar1 + 1,0);
  if (pcVar3 != (char *)0x0) {
    iVar1 = iVar1 + 2;
    do {
      putc(0x20,_stdout);
      fputs(pcVar3,_stdout);
      pcVar3 = (char *)lua_tolstring(L,iVar1,0);
      iVar1 = iVar1 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  putc(10,_stdout);
  lua_settop(L,0);
  return;
}

Assistant:

static void print_jit_status(lua_State *L)
{
  int n;
  const char *s;
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, -1, "jit");  /* Get jit.* module table. */
  lua_remove(L, -2);
  lua_getfield(L, -1, "status");
  lua_remove(L, -2);
  n = lua_gettop(L);
  lua_call(L, 0, LUA_MULTRET);
  fputs(lua_toboolean(L, n) ? "JIT: ON" : "JIT: OFF", stdout);
  for (n++; (s = lua_tostring(L, n)); n++) {
    putc(' ', stdout);
    fputs(s, stdout);
  }
  putc('\n', stdout);
  lua_settop(L, 0);  /* clear stack */
}